

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Boundary_Uniform.cpp
# Opt level: O0

void __thiscall
Nova::Boundary_Uniform<float,_3>::Find_Ghost_Regions
          (Boundary_Uniform<float,_3> *this,T_Grid *grid,Array<Nova::Range<int,_3>_> *regions,
          int number_of_ghost_cells)

{
  undefined1 local_54 [8];
  Range<int,_3> ghost;
  Range<int,_3> domain;
  int number_of_ghost_cells_local;
  Array<Nova::Range<int,_3>_> *regions_local;
  T_Grid *grid_local;
  Boundary_Uniform<float,_3> *this_local;
  
  Grid<float,_3>::Cell_Indices((Range<int,_3> *)(ghost.max_corner._data._M_elems + 1),grid,0);
  Range<int,_3>::Thickened
            ((Range<int,_3> *)local_54,(Range<int,_3> *)(ghost.max_corner._data._M_elems + 1),
             number_of_ghost_cells);
  Array<Nova::Range<int,_3>_>::resize(regions,6);
  Find_Ghost_Regions_Helper
            (regions,(Range<int,_3> *)(ghost.max_corner._data._M_elems + 1),
             (Range<int,_3> *)local_54);
  return;
}

Assistant:

void Boundary_Uniform<T,d>::
Find_Ghost_Regions(const T_Grid& grid,Array<Range<int,d> >& regions,const int number_of_ghost_cells) const
{
    Range<int,d> domain=grid.Cell_Indices(),ghost=domain.Thickened(number_of_ghost_cells);
    regions.resize(T_Grid::number_of_faces_per_cell);
    Find_Ghost_Regions_Helper(regions,domain,ghost);
}